

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v9::detail::bigint::remove_leading_zeros(bigint *this)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (this->bigits_).super_buffer<unsigned_int>.size_;
  uVar3 = (uint)uVar6;
  uVar6 = uVar6 & 0xffffffff;
  uVar5 = 1;
  if ((int)uVar3 < 1) {
    uVar5 = uVar3;
  }
  uVar3 = uVar3 + 1;
  do {
    uVar4 = uVar5;
    if ((int)uVar6 < 2) break;
    uVar3 = uVar3 - 1;
    lVar2 = uVar6 - 1;
    uVar6 = uVar6 - 1;
    uVar4 = uVar3;
  } while ((this->bigits_).super_buffer<unsigned_int>.ptr_[lVar2] == 0);
  if ((int)uVar4 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                ,0x199,"negative value");
  }
  uVar6 = (ulong)uVar4;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar6) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar6);
  }
  uVar1 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar1 < uVar6) {
    uVar6 = uVar1;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar6;
  return;
}

Assistant:

FMT_CONSTEXPR20 void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }